

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

RICH_DANS_HEADER * __thiscall PEFile::getRichHeaderBgn(PEFile *this,RICH_SIGNATURE *richSign)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long local_40;
  offset_t offset;
  RICH_DANS_HEADER *dansHdr;
  offset_t richOffset;
  DWORD xorkey;
  RICH_SIGNATURE *richSign_local;
  PEFile *this_local;
  
  if (richSign == (RICH_SIGNATURE *)0x0) {
    this_local = (PEFile *)0x0;
  }
  else {
    uVar1 = richSign->checksum;
    iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[6])(this,richSign,0);
    offset = 0;
    for (local_40 = CONCAT44(extraout_var,iVar2) + -0x18; local_40 != 0; local_40 = local_40 + -4) {
      iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[7])(this,local_40,0x18,0);
      offset = CONCAT44(extraout_var_00,iVar2);
      if (((uint *)offset == (uint *)0x0) || (*(uint *)offset == (uVar1 ^ 0x536e6144))) break;
    }
    if ((offset == 0) || (*(uint *)offset != (uVar1 ^ 0x536e6144))) {
      this_local = (PEFile *)0x0;
    }
    else {
      this_local = (PEFile *)offset;
    }
  }
  return (RICH_DANS_HEADER *)this_local;
}

Assistant:

pe::RICH_DANS_HEADER* PEFile::getRichHeaderBgn(pe::RICH_SIGNATURE* richSign)
{
    if (!richSign) return NULL;

    DWORD xorkey = richSign->checksum;
    const offset_t richOffset = this->getOffset(richSign);

    pe::RICH_DANS_HEADER* dansHdr = NULL;

    offset_t offset = richOffset - sizeof(pe::RICH_DANS_HEADER);
    while (offset > 0) {
        dansHdr = (pe::RICH_DANS_HEADER*) this->getContentAt(offset, sizeof(pe::RICH_DANS_HEADER));
        if (!dansHdr) {
            break;
        }
        if (dansHdr->dansId == (pe::DANS_HDR_MAGIC ^ xorkey)) {
            break; //got it!
        }
        //walking back
        offset -= sizeof(DWORD);
    }
    if (!dansHdr || dansHdr->dansId != (pe::DANS_HDR_MAGIC ^ xorkey)) {
        return NULL; //not found
    }
    return dansHdr;
}